

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_FindUniqueTid
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  char *pcVar2;
  
  if (numparam < 1) {
    param = defaultparam->Array;
    if ((param->field_0).field_3.Type != '\0') {
      pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_0042e052;
    }
    iVar1 = (param->field_0).i;
  }
  else {
    if ((param->field_0).field_3.Type != '\0') {
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
LAB_0042e052:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xcfc,
                    "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = (param->field_0).i;
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type == '\0') goto LAB_0042dfd6;
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0042e071;
    }
    param = defaultparam->Array;
  }
  if (param[1].field_0.field_3.Type == '\0') {
LAB_0042dfd6:
    iVar1 = P_FindUniqueTID(iVar1,param[1].field_0.i);
    if (numret < 1) {
      iVar1 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0xcfe,
                      "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      if (ret->RegType != '\0') {
        __assert_fail("RegType == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                      ,0x13f,"void VMReturn::SetInt(int)");
      }
      *(int *)ret->Location = iVar1;
      iVar1 = 1;
    }
    return iVar1;
  }
  pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0042e071:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0xcfd,
                "int AF_AActor_FindUniqueTid(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, FindUniqueTid)
{
	PARAM_PROLOGUE;
	PARAM_INT_DEF(start);
	PARAM_INT_DEF(limit);
	ACTION_RETURN_INT(P_FindUniqueTID(start, limit));
}